

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool CheckInputScripts(CTransaction *tx,TxValidationState *state,CCoinsViewCache *inputs,uint flags,
                      bool cacheSigStore,bool cacheFullScriptStore,
                      PrecomputedTransactionData *txdata,ValidationCache *validation_cache,
                      vector<CScriptCheck,_std::allocator<CScriptCheck>_> *pvChecks)

{
  pointer puVar1;
  __atomic_base<unsigned_char> *p_Var2;
  pointer pCVar3;
  uchar *puVar4;
  SignatureCache *pSVar5;
  pointer puVar6;
  pointer pCVar7;
  uint256 e;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  CSHA256 *pCVar11;
  ulong uVar12;
  CTxOut *__args;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  pointer args;
  pointer outpoint;
  ValidationCache *pVVar16;
  uint uVar17;
  uint uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  CScriptCheck check2;
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  CSHA256 hasher;
  uint256 hashCacheEntry;
  bool local_1f2;
  uint local_1cc;
  undefined1 local_1c8 [32];
  string local_1a8;
  string local_188;
  undefined1 local_168 [36];
  uint local_144;
  CTransaction *local_140;
  uint local_138;
  uint local_134;
  bool local_130;
  ScriptError local_12c;
  PrecomputedTransactionData *local_128;
  SignatureCache *local_120;
  CScriptCheck local_118;
  CSHA256 local_c0;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  bVar20 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1cc = flags;
  bVar9 = CTransaction::IsCoinBase(tx);
  local_1f2 = true;
  if (!bVar9) {
    if (pvChecks != (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0) {
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::reserve
                (pvChecks,((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                           (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                 .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
    }
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    pVVar16 = validation_cache;
    pCVar11 = &local_c0;
    for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
      *(undefined8 *)pCVar11->s = *(undefined8 *)(pVVar16->m_script_execution_cache_hasher).s;
      pVVar16 = (ValidationCache *)((long)pVVar16 + (ulong)bVar20 * -0x10 + 8);
      pCVar11 = (CSHA256 *)((long)pCVar11 + (ulong)bVar20 * -0x10 + 8);
    }
    pCVar11 = CSHA256::Write(&local_c0,(uchar *)&tx->m_witness_hash,0x20);
    lVar13 = 4;
    pCVar11 = CSHA256::Write(pCVar11,(uchar *)&local_1cc,4);
    CSHA256::Finalize(pCVar11,(uchar *)&local_58);
    uVar12 = (ulong)(validation_cache->m_script_execution_cache).size;
    uVar14 = (local_58 & 0xffffffff) * uVar12;
    uVar15 = uVar14 >> 0x20;
    local_118.m_tx_out.nValue._4_4_ = (int)((local_58 >> 0x20) * uVar12 >> 0x20);
    local_118.m_tx_out.nValue._0_4_ = (int)(uVar14 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._0_4_ =
         (int)((uStack_50 & 0xffffffff) * uVar12 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._4_4_ =
         (int)((uStack_50 >> 0x20) * uVar12 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._12_4_ =
         (int)((local_48 >> 0x20) * uVar12 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity =
         (int)((local_48 & 0xffffffff) * uVar12 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._16_4_ =
         (int)((uStack_40 & 0xffffffff) * uVar12 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._20_4_ =
         (int)((uStack_40 >> 0x20) * uVar12 >> 0x20);
    puVar6 = (validation_cache->m_script_execution_cache).table.
             super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
             _M_start;
    puVar1 = puVar6 + uVar15;
    puVar4 = (uchar *)((long)&puVar6[uVar15].super_base_blob<256U>.m_data + 0x10);
    auVar23[0] = -(*puVar4 == (uchar)local_48);
    auVar23[1] = -(puVar4[1] == local_48._1_1_);
    auVar23[2] = -(puVar4[2] == local_48._2_1_);
    auVar23[3] = -(puVar4[3] == local_48._3_1_);
    auVar23[4] = -(puVar4[4] == local_48._4_1_);
    auVar23[5] = -(puVar4[5] == local_48._5_1_);
    auVar23[6] = -(puVar4[6] == local_48._6_1_);
    auVar23[7] = -(puVar4[7] == local_48._7_1_);
    auVar23[8] = -(puVar4[8] == (uchar)uStack_40);
    auVar23[9] = -(puVar4[9] == uStack_40._1_1_);
    auVar23[10] = -(puVar4[10] == uStack_40._2_1_);
    auVar23[0xb] = -(puVar4[0xb] == uStack_40._3_1_);
    auVar23[0xc] = -(puVar4[0xc] == uStack_40._4_1_);
    auVar23[0xd] = -(puVar4[0xd] == uStack_40._5_1_);
    auVar23[0xe] = -(puVar4[0xe] == uStack_40._6_1_);
    auVar23[0xf] = -(puVar4[0xf] == uStack_40._7_1_);
    auVar21[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == (uchar)local_58);
    auVar21[1] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 1) == local_58._1_1_);
    auVar21[2] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 2) == local_58._2_1_);
    auVar21[3] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 3) == local_58._3_1_);
    auVar21[4] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 4) == local_58._4_1_);
    auVar21[5] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 5) == local_58._5_1_);
    auVar21[6] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 6) == local_58._6_1_);
    auVar21[7] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 7) == local_58._7_1_);
    auVar21[8] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 8) == (uchar)uStack_50
                  );
    auVar21[9] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 9) == uStack_50._1_1_)
    ;
    auVar21[10] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 10) ==
                   uStack_50._2_1_);
    auVar21[0xb] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xb) ==
                    uStack_50._3_1_);
    auVar21[0xc] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xc) ==
                    uStack_50._4_1_);
    auVar21[0xd] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xd) ==
                    uStack_50._5_1_);
    auVar21[0xe] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xe) ==
                    uStack_50._6_1_);
    auVar21[0xf] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xf) ==
                    uStack_50._7_1_);
    auVar21 = auVar21 & auVar23;
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
      bVar9 = true;
    }
    else {
      do {
        bVar9 = lVar13 != 0x20;
        if (lVar13 == 0x20) goto LAB_00401215;
        uVar15 = (ulong)*(uint *)((long)&local_118.m_tx_out.nValue + lVar13);
        puVar1 = puVar6 + uVar15;
        puVar4 = (uchar *)((long)&puVar6[uVar15].super_base_blob<256U>.m_data + 0x10);
        auVar24[0] = -(*puVar4 == (uchar)local_48);
        auVar24[1] = -(puVar4[1] == local_48._1_1_);
        auVar24[2] = -(puVar4[2] == local_48._2_1_);
        auVar24[3] = -(puVar4[3] == local_48._3_1_);
        auVar24[4] = -(puVar4[4] == local_48._4_1_);
        auVar24[5] = -(puVar4[5] == local_48._5_1_);
        auVar24[6] = -(puVar4[6] == local_48._6_1_);
        auVar24[7] = -(puVar4[7] == local_48._7_1_);
        auVar24[8] = -(puVar4[8] == (uchar)uStack_40);
        auVar24[9] = -(puVar4[9] == uStack_40._1_1_);
        auVar24[10] = -(puVar4[10] == uStack_40._2_1_);
        auVar24[0xb] = -(puVar4[0xb] == uStack_40._3_1_);
        auVar24[0xc] = -(puVar4[0xc] == uStack_40._4_1_);
        auVar24[0xd] = -(puVar4[0xd] == uStack_40._5_1_);
        auVar24[0xe] = -(puVar4[0xe] == uStack_40._6_1_);
        auVar24[0xf] = -(puVar4[0xf] == uStack_40._7_1_);
        auVar22[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == (uchar)local_58);
        auVar22[1] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 1) ==
                      local_58._1_1_);
        auVar22[2] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 2) ==
                      local_58._2_1_);
        auVar22[3] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 3) ==
                      local_58._3_1_);
        auVar22[4] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 4) ==
                      local_58._4_1_);
        auVar22[5] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 5) ==
                      local_58._5_1_);
        auVar22[6] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 6) ==
                      local_58._6_1_);
        auVar22[7] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 7) ==
                      local_58._7_1_);
        auVar22[8] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 8) ==
                      (uchar)uStack_50);
        auVar22[9] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 9) ==
                      uStack_50._1_1_);
        auVar22[10] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 10) ==
                       uStack_50._2_1_);
        auVar22[0xb] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xb) ==
                        uStack_50._3_1_);
        auVar22[0xc] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xc) ==
                        uStack_50._4_1_);
        auVar22[0xd] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xd) ==
                        uStack_50._5_1_);
        auVar22[0xe] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xe) ==
                        uStack_50._6_1_);
        auVar22[0xf] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xf) ==
                        uStack_50._7_1_);
        auVar22 = auVar22 & auVar24;
        lVar13 = lVar13 + 4;
      } while ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff);
    }
    if (!cacheFullScriptStore) {
      LOCK();
      p_Var2 = &(validation_cache->m_script_execution_cache).collection_flags.mem._M_t.
                super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl
                [uVar15 >> 3].super___atomic_base<unsigned_char>;
      p_Var2->_M_i = p_Var2->_M_i | (byte)(1 << ((byte)uVar15 & 7));
      UNLOCK();
    }
LAB_00401215:
    if (!bVar9) {
      if (txdata->m_spent_outputs_ready == false) {
        local_118.m_tx_out._0_16_ = (undefined1  [16])0x0;
        local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::reserve
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_118,
                   ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
        outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (outpoint != pCVar7) {
          do {
            __args = &CCoinsViewCache::AccessCoin(inputs,&outpoint->prevout)->out;
            if (__args->nValue == -1) {
              __assert_fail("!coin.IsSpent()",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x875,
                            "bool CheckInputScripts(const CTransaction &, TxValidationState &, const CCoinsViewCache &, unsigned int, bool, bool, PrecomputedTransactionData &, ValidationCache &, std::vector<CScriptCheck> *)"
                           );
            }
            std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<CTxOut_const&>
                      ((vector<CTxOut,std::allocator<CTxOut>> *)&local_118,__args);
            outpoint = outpoint + 1;
          } while (outpoint != pCVar7);
        }
        PrecomputedTransactionData::Init<CTransaction>
                  (txdata,tx,(vector<CTxOut,_std::allocator<CTxOut>_> *)&local_118,false);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_118);
      }
      if (((long)(txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 +
          ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x4ec4ec4ec4ec4ec5 != 0) {
        __assert_fail("txdata.m_spent_outputs.size() == tx.vin.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x87a,
                      "bool CheckInputScripts(const CTransaction &, TxValidationState &, const CCoinsViewCache &, unsigned int, bool, bool, PrecomputedTransactionData &, ValidationCache &, std::vector<CScriptCheck> *)"
                     );
      }
      bVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (bVar9) {
        pSVar5 = &validation_cache->m_signature_cache;
        uVar17 = 1;
        uVar12 = 0;
        do {
          uVar8 = local_1cc;
          uVar18 = uVar17 - 1;
          args = (txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          local_118.m_tx_out.nValue =
               *(undefined8 *)((long)(&args[uVar12].scriptPubKey + -1) + 0x18);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                    (&local_118.m_tx_out.scriptPubKey.super_CScriptBase,
                     &args[uVar12].scriptPubKey.super_CScriptBase);
          local_118.nFlags = uVar8;
          local_118.error = SCRIPT_ERR_UNKNOWN_ERROR;
          local_118.txdata = txdata;
          local_118.ptxTo = tx;
          local_118.nIn = uVar18;
          local_118.cacheStore = cacheSigStore;
          local_118.m_signature_cache = pSVar5;
          if (pvChecks == (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0) {
            bVar10 = CScriptCheck::operator()(&local_118);
            uVar8 = local_1cc;
            bVar19 = true;
            if (!bVar10) {
              if ((local_1cc & 0x1df1ca) == 0) {
LAB_004015a8:
                ScriptErrorString_abi_cxx11_(&local_188,local_118.error);
                tinyformat::format<std::__cxx11::string>
                          ((string *)local_168,
                           (tinyformat *)"mandatory-script-verify-flag-failed (%s)",
                           (char *)&local_188,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
                local_1f2 = ValidationState<TxValidationResult>::Invalid
                                      (&state->super_ValidationState<TxValidationResult>,
                                       TX_CONSENSUS,(string *)local_168,&local_1a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
                  operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                pCVar3 = (txdata->m_spent_outputs).
                         super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar12;
                local_168._0_8_ = pCVar3->nValue;
                prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_168 + 8),
                           &(pCVar3->scriptPubKey).super_CScriptBase);
                local_134 = uVar8 & 0xffe20e35;
                local_12c = SCRIPT_ERR_UNKNOWN_ERROR;
                local_128 = txdata;
                local_140 = tx;
                local_138 = uVar18;
                local_130 = cacheSigStore;
                local_120 = pSVar5;
                bVar19 = CScriptCheck::operator()((CScriptCheck *)local_168);
                if (bVar19) {
                  ScriptErrorString_abi_cxx11_(&local_1a8,local_118.error);
                  tinyformat::format<std::__cxx11::string>
                            (&local_188,(tinyformat *)"non-mandatory-script-verify-flag (%s)",
                             (char *)&local_1a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args);
                  local_1c8._0_8_ = local_1c8 + 0x10;
                  args = (pointer)local_1c8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)args,"");
                  local_1f2 = ValidationState<TxValidationResult>::Invalid
                                        (&state->super_ValidationState<TxValidationResult>,
                                         TX_NOT_STANDARD,&local_188,(string *)args);
                  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
                    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                    operator_delete(local_1a8._M_dataplus._M_p,
                                    local_1a8.field_2._M_allocated_capacity + 1);
                  }
                }
                if (0x1c < local_144) {
                  free((void *)local_168._8_8_);
                  local_168._8_8_ = (char *)0x0;
                }
                if (!bVar19) goto LAB_004015a8;
              }
              bVar19 = false;
            }
          }
          else {
            bVar19 = true;
            std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::emplace_back<CScriptCheck>
                      (pvChecks,&local_118);
          }
          if (0x1c < local_118.m_tx_out.scriptPubKey.super_CScriptBase._size) {
            free(local_118.m_tx_out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect
                );
            local_118.m_tx_out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
                 (char *)0;
          }
          if (!bVar19) break;
          uVar12 = (ulong)uVar17;
          uVar14 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
          uVar17 = uVar17 + 1;
          bVar19 = uVar14 - uVar12 != 0;
          bVar9 = uVar12 <= uVar14 && bVar19;
        } while (uVar12 <= uVar14 && bVar19);
      }
      if (bVar9) goto LAB_004016eb;
      if (cacheFullScriptStore &&
          pvChecks == (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0) {
        e.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uStack_50;
        e.super_base_blob<256U>.m_data._M_elems[9] = uStack_50._1_1_;
        e.super_base_blob<256U>.m_data._M_elems[10] = uStack_50._2_1_;
        e.super_base_blob<256U>.m_data._M_elems[0xb] = uStack_50._3_1_;
        e.super_base_blob<256U>.m_data._M_elems[0xc] = uStack_50._4_1_;
        e.super_base_blob<256U>.m_data._M_elems[0xd] = uStack_50._5_1_;
        e.super_base_blob<256U>.m_data._M_elems[0xe] = uStack_50._6_1_;
        e.super_base_blob<256U>.m_data._M_elems[0xf] = uStack_50._7_1_;
        e.super_base_blob<256U>.m_data._M_elems[0] = (uchar)local_58;
        e.super_base_blob<256U>.m_data._M_elems[1] = local_58._1_1_;
        e.super_base_blob<256U>.m_data._M_elems[2] = local_58._2_1_;
        e.super_base_blob<256U>.m_data._M_elems[3] = local_58._3_1_;
        e.super_base_blob<256U>.m_data._M_elems[4] = local_58._4_1_;
        e.super_base_blob<256U>.m_data._M_elems[5] = local_58._5_1_;
        e.super_base_blob<256U>.m_data._M_elems[6] = local_58._6_1_;
        e.super_base_blob<256U>.m_data._M_elems[7] = local_58._7_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)local_48;
        e.super_base_blob<256U>.m_data._M_elems[0x11] = local_48._1_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x12] = local_48._2_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x13] = local_48._3_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x14] = local_48._4_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x15] = local_48._5_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x16] = local_48._6_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x17] = local_48._7_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uStack_40;
        e.super_base_blob<256U>.m_data._M_elems[0x19] = uStack_40._1_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x1a] = uStack_40._2_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x1b] = uStack_40._3_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x1c] = uStack_40._4_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x1d] = uStack_40._5_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x1e] = uStack_40._6_1_;
        e.super_base_blob<256U>.m_data._M_elems[0x1f] = uStack_40._7_1_;
        CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                  (&validation_cache->m_script_execution_cache,e);
      }
    }
    local_1f2 = true;
  }
LAB_004016eb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_1f2;
}

Assistant:

bool CheckInputScripts(const CTransaction& tx, TxValidationState& state,
                       const CCoinsViewCache& inputs, unsigned int flags, bool cacheSigStore,
                       bool cacheFullScriptStore, PrecomputedTransactionData& txdata,
                       ValidationCache& validation_cache,
                       std::vector<CScriptCheck>* pvChecks)
{
    if (tx.IsCoinBase()) return true;

    if (pvChecks) {
        pvChecks->reserve(tx.vin.size());
    }

    // First check if script executions have been cached with the same
    // flags. Note that this assumes that the inputs provided are
    // correct (ie that the transaction hash which is in tx's prevouts
    // properly commits to the scriptPubKey in the inputs view of that
    // transaction).
    uint256 hashCacheEntry;
    CSHA256 hasher = validation_cache.ScriptExecutionCacheHasher();
    hasher.Write(UCharCast(tx.GetWitnessHash().begin()), 32).Write((unsigned char*)&flags, sizeof(flags)).Finalize(hashCacheEntry.begin());
    AssertLockHeld(cs_main); //TODO: Remove this requirement by making CuckooCache not require external locks
    if (validation_cache.m_script_execution_cache.contains(hashCacheEntry, !cacheFullScriptStore)) {
        return true;
    }

    if (!txdata.m_spent_outputs_ready) {
        std::vector<CTxOut> spent_outputs;
        spent_outputs.reserve(tx.vin.size());

        for (const auto& txin : tx.vin) {
            const COutPoint& prevout = txin.prevout;
            const Coin& coin = inputs.AccessCoin(prevout);
            assert(!coin.IsSpent());
            spent_outputs.emplace_back(coin.out);
        }
        txdata.Init(tx, std::move(spent_outputs));
    }
    assert(txdata.m_spent_outputs.size() == tx.vin.size());

    for (unsigned int i = 0; i < tx.vin.size(); i++) {

        // We very carefully only pass in things to CScriptCheck which
        // are clearly committed to by tx' witness hash. This provides
        // a sanity check that our caching is not introducing consensus
        // failures through additional data in, eg, the coins being
        // spent being checked as a part of CScriptCheck.

        // Verify signature
        CScriptCheck check(txdata.m_spent_outputs[i], tx, validation_cache.m_signature_cache, i, flags, cacheSigStore, &txdata);
        if (pvChecks) {
            pvChecks->emplace_back(std::move(check));
        } else if (!check()) {
            if (flags & STANDARD_NOT_MANDATORY_VERIFY_FLAGS) {
                // Check whether the failure was caused by a
                // non-mandatory script verification check, such as
                // non-standard DER encodings or non-null dummy
                // arguments; if so, ensure we return NOT_STANDARD
                // instead of CONSENSUS to avoid downstream users
                // splitting the network between upgraded and
                // non-upgraded nodes by banning CONSENSUS-failing
                // data providers.
                CScriptCheck check2(txdata.m_spent_outputs[i], tx, validation_cache.m_signature_cache, i,
                        flags & ~STANDARD_NOT_MANDATORY_VERIFY_FLAGS, cacheSigStore, &txdata);
                if (check2())
                    return state.Invalid(TxValidationResult::TX_NOT_STANDARD, strprintf("non-mandatory-script-verify-flag (%s)", ScriptErrorString(check.GetScriptError())));
            }
            // MANDATORY flag failures correspond to
            // TxValidationResult::TX_CONSENSUS. Because CONSENSUS
            // failures are the most serious case of validation
            // failures, we may need to consider using
            // RECENT_CONSENSUS_CHANGE for any script failure that
            // could be due to non-upgraded nodes which we may want to
            // support, to avoid splitting the network (but this
            // depends on the details of how net_processing handles
            // such errors).
            return state.Invalid(TxValidationResult::TX_CONSENSUS, strprintf("mandatory-script-verify-flag-failed (%s)", ScriptErrorString(check.GetScriptError())));
        }
    }

    if (cacheFullScriptStore && !pvChecks) {
        // We executed all of the provided scripts, and were told to
        // cache the result. Do so now.
        validation_cache.m_script_execution_cache.insert(hashCacheEntry);
    }

    return true;
}